

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accept.c
# Opt level: O0

mpt_input * mpt_accept(mpt_socket *socket)

{
  int __fd;
  int sockfd;
  mpt_input *in;
  mpt_socket *pmStack_18;
  mpt_socket sock;
  mpt_socket *socket_local;
  
  in._4_4_ = 0xffffffff;
  pmStack_18 = socket;
  __fd = accept(socket->_id,(sockaddr *)0x0,(socklen_t *)0x0);
  if (__fd < 0) {
    socket_local = (mpt_socket *)0x0;
  }
  else {
    in._4_4_ = __fd;
    socket_local = (mpt_socket *)
                   mpt_stream_input((mpt_socket *)((long)&in + 4),mpt_accept::flags,0,2);
    if ((mpt_input *)socket_local == (mpt_input *)0x0) {
      close(__fd);
    }
  }
  return (mpt_input *)socket_local;
}

Assistant:

extern MPT_INTERFACE(input) *mpt_accept(const MPT_STRUCT(socket) *socket)
{
	static int flags = MPT_STREAMFLAG(RdWr) | MPT_STREAMFLAG(Buffer);
	MPT_STRUCT(socket) sock = MPT_SOCKET_INIT;
	MPT_INTERFACE(input) *in;
	int sockfd;
	
	if ((sockfd = accept(socket->_id, 0, 0)) < 0) {
		return 0;
	}
	sock._id = sockfd;
	
	/* bidirectional with 2 byte message ID */
	if (!(in = mpt_stream_input(&sock, flags, 0, sizeof(uint16_t)))) {
		(void) close(sockfd);
	}
	return in;
}